

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindTexturesTest::iterate(FunctionalBindTexturesTest *this)

{
  ostringstream *this_00;
  Context *context;
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  pointer pTVar4;
  TestError *this_01;
  uint uVar5;
  GLenum GVar6;
  Texture *this_02;
  long lVar7;
  GLenum *pGVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  GLint max_textures;
  long local_240;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_texture_ids;
  Buffer buffer;
  vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> texture;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  max_textures = 0;
  (**(code **)(lVar7 + 0x868))(0x8b4d,&max_textures);
  local_240 = lVar7;
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xab7);
  buffer.m_id = 0xffffffff;
  buffer.m_context = (Context *)0x0;
  buffer.m_target = 0x8892;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texture.
  super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::resize
            (&texture,(long)max_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&texture_ids,(long)max_textures);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&t_texture_ids,(long)max_textures);
  MultiBind::Buffer::InitData
            (&buffer,(this->super_TestCase).m_context,0x8c2a,0x88ea,0x10,(GLvoid *)0x0);
  lVar7 = 0;
  do {
    GVar6 = *(GLenum *)((long)&s_texture_infos + lVar7);
    this_02 = (Texture *)
              ((long)&(texture.
                       super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar7);
    context = (this->super_TestCase).m_context;
    if (GVar6 == 0x8c2a) {
      MultiBind::Texture::InitBuffer(this_02,context,0x8058,buffer.m_id);
    }
    else {
      MultiBind::Texture::InitStorage(this_02,context,GVar6,1,0x8058,6,6,6,false);
    }
    (**(code **)(local_240 + 0xb8))(GVar6,0);
    dVar3 = (**(code **)(local_240 + 0x800))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x415);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0xb0);
  if (0xb < max_textures) {
    lVar7 = 0xb;
    lVar9 = 0xb0;
    do {
      MultiBind::Texture::InitStorage
                ((Texture *)
                 ((long)&(texture.
                          super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_id + lVar9),
                 (this->super_TestCase).m_context,0xde1,1,0x8058,6,6,6,false);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar7 < max_textures);
  }
  (**(code **)(local_240 + 0xb8))(0xde1,0);
  dVar3 = (**(code **)(local_240 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x415);
  if (0 < max_textures) {
    lVar7 = 0;
    pTVar4 = texture.
             super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] = pTVar4->m_id;
      lVar7 = lVar7 + 1;
      pTVar4 = pTVar4 + 1;
    } while (lVar7 < max_textures);
  }
  (**(code **)(local_240 + 200))(0);
  dVar3 = (**(code **)(local_240 + 0x800))();
  glu::checkError(dVar3,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xaeb);
  if (max_textures < 1) {
    uVar5 = -((uint)-max_textures >> 1);
  }
  else {
    pGVar8 = &DAT_020c7a84;
    uVar10 = 0;
    do {
      GVar6 = 0x8069;
      if (uVar10 < 0xb) {
        GVar6 = *pGVar8;
      }
      checkTextureBinding((this->super_TestCase).m_context,GVar6,(GLuint)uVar10,
                          texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
      uVar10 = uVar10 + 1;
      pGVar8 = pGVar8 + 4;
    } while ((long)uVar10 < (long)max_textures);
    uVar5 = max_textures / 2;
    if (0 < max_textures) {
      lVar7 = 0;
      do {
        t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < max_textures);
      bVar12 = max_textures != 1;
      goto LAB_008bede9;
    }
  }
  bVar12 = false;
LAB_008bede9:
  (**(code **)(local_240 + 200))
            (0,uVar5,t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(local_240 + 0x800))();
  glu::checkError(dVar3,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb00);
  if (bVar12) {
    pGVar8 = &DAT_020c7a84;
    uVar10 = 0;
    do {
      GVar6 = 0x8069;
      if (uVar10 < 0xb) {
        GVar6 = *pGVar8;
      }
      checkTextureBinding((this->super_TestCase).m_context,GVar6,(GLuint)uVar10,0);
      uVar10 = uVar10 + 1;
      pGVar8 = pGVar8 + 4;
    } while (uVar5 != uVar10);
  }
  if ((int)uVar5 < max_textures) {
    uVar10 = (ulong)(int)uVar5;
    pGVar8 = &DAT_020c7a84 + uVar10 * 4;
    do {
      GVar6 = 0x8069;
      if (uVar10 < 0xb) {
        GVar6 = *pGVar8;
      }
      checkTextureBinding((this->super_TestCase).m_context,GVar6,(GLuint)uVar10,
                          texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10]);
      uVar10 = uVar10 + 1;
      pGVar8 = pGVar8 + 4;
    } while ((long)uVar10 < (long)max_textures);
  }
  (**(code **)(local_240 + 200))(uVar5,max_textures - uVar5,0);
  dVar3 = (**(code **)(local_240 + 0x800))();
  glu::checkError(dVar3,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb13);
  if (0 < max_textures) {
    pGVar8 = &DAT_020c7a84;
    uVar10 = 0;
    do {
      GVar6 = 0x8069;
      if (uVar10 < 0xb) {
        GVar6 = *pGVar8;
      }
      checkTextureBinding((this->super_TestCase).m_context,GVar6,(GLuint)uVar10,0);
      uVar10 = uVar10 + 1;
      pGVar8 = pGVar8 + 4;
    } while ((long)uVar10 < (long)max_textures);
  }
  uVar5 = 1;
  while( true ) {
    cVar1 = (**(code **)(local_240 + 0xcc8))(uVar5);
    if (cVar1 != '\x01') break;
    uVar5 = uVar5 + 1;
  }
  *texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = uVar5;
  (**(code **)(local_240 + 200))(0,max_textures);
  local_1c0.m_value = (**(code **)(local_240 + 0x800))();
  if (local_1c0.m_value == 0x502) {
    checkTextureBinding((this->super_TestCase).m_context,0x8068,0,0);
    uVar10 = (ulong)(uint)max_textures;
    if (1 < max_textures) {
      uVar11 = 1;
      pGVar8 = &DAT_020c7a94;
      do {
        GVar6 = 0x8069;
        if (uVar11 < 0xb) {
          GVar6 = *pGVar8;
        }
        checkTextureBinding((this->super_TestCase).m_context,GVar6,(GLuint)uVar11,
                            texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11]);
        uVar11 = uVar11 + 1;
        uVar10 = (ulong)max_textures;
        pGVar8 = pGVar8 + 4;
      } while ((long)uVar11 < (long)uVar10);
    }
    (**(code **)(local_240 + 200))(0,uVar10,0);
    dVar3 = (**(code **)(local_240 + 0x800))();
    glu::checkError(dVar3,"BindTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xb3b);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    if (t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)t_texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)t_texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::~vector
              (&texture);
    MultiBind::Buffer::~Buffer(&buffer);
    return STOP;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"File: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", line: ",8);
  std::ostream::operator<<(this_00,0xb31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Got wrong error: ",0x13);
  local_1c0.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", expected: ",0xc);
  local_1d0.m_getName = glu::getErrorName;
  local_1d0.m_value = 0x502;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", message: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"BindTextures with invalid texture id",0x24);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xb31);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindTexturesTest::iterate()
{
	static const GLuint depth  = 6;
	static const GLuint height = 6;
	static const GLuint width  = 6;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLuint invalid_id   = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_textures = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	Buffer				 buffer;
	std::vector<Texture> texture;
	std::vector<GLuint>  texture_ids;
	std::vector<GLuint>  t_texture_ids;

	texture.resize(max_textures);
	texture_ids.resize(max_textures);
	t_texture_ids.resize(max_textures);

	/* Prepare buffer */
	buffer.InitData(m_context, GL_TEXTURE_BUFFER, GL_DYNAMIC_COPY, 16 /* size */, 0 /* data */);

	/* Prepare textures */
	for (size_t i = 0; i < s_n_texture_tragets; ++i)
	{
		const GLenum target = s_texture_infos[i].m_target;

		if (GL_TEXTURE_BUFFER != target)
		{
			texture[i].InitStorage(m_context, target, 1, GL_RGBA8, width, height, depth);
		}
		else
		{
			texture[i].InitBuffer(m_context, GL_RGBA8, buffer.m_id);
		}

		/* Unbind */
		Texture::Bind(gl, 0, target);
	}

	for (GLint i = s_n_texture_tragets; i < max_textures; ++i)
	{
		texture[i].InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGBA8, width, height, depth);
	}

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);

	for (GLint i = 0; i < max_textures; ++i)
	{
		texture_ids[i] = texture[i].m_id;
	}

	/*
	 * - execute BindTextures to bind all textures;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * set;
	 */
	gl.bindTextures(0, max_textures, &texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/*
	 * - execute BindTextures for the first half of units with <textures> filled
	 * with zeros, to unbind those units;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * unbound;
	 */
	GLint half_index = max_textures / 2;

	for (GLint i = 0; i < max_textures; ++i)
	{
		t_texture_ids[i] = 0;
	}

	gl.bindTextures(0, half_index, &t_texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < half_index; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, 0);
	}

	for (GLint i = half_index; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/*
	 * - execute BindTextures for the second half of units with NULL as<textures>,
	 * to unbind those units;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * unbound;
	 */
	gl.bindTextures(half_index, max_textures - half_index, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, 0);
	}

	/*
	 * - modify <textures> so first entry is invalid;
	 * - execute BindTextures to bind all textures; It is expected that
	 * INVALID_OPERATION will be generated;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * set;
	 */

	/* Find invalid id */
	while (1)
	{
		if (GL_TRUE != gl.isTexture(invalid_id))
		{
			break;
		}

		invalid_id += 1;
	}

	/* Set invalid id */
	texture_ids[0] = invalid_id;

	gl.bindTextures(0, max_textures, &texture_ids[0]);
	CHECK_ERROR(GL_INVALID_OPERATION, "BindTextures with invalid texture id");

	checkTextureBinding(m_context, getBinding(0), 0, 0);
	for (GLint i = 1; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/* - unbind all textures. */
	gl.bindTextures(0, max_textures, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}